

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

Primer * __thiscall ASDCP::MXF::Primer::WriteToFile(Primer *this,FileWriter *Writer)

{
  uint in_EDX;
  FrameBuffer Buffer;
  FrameBuffer local_b0;
  Result_t local_88 [104];
  
  FrameBuffer::FrameBuffer(&local_b0);
  FrameBuffer::Capacity((FrameBuffer *)this,(ui32_t)&local_b0);
  if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
    (**(code **)(*(long *)Writer + 0x80))(local_88,Writer,&local_b0);
    Kumu::Result_t::operator=((Result_t *)this,local_88);
    Kumu::Result_t::~Result_t(local_88);
    if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
      Kumu::FileWriter::Write((uchar *)local_88,in_EDX,(uint *)local_b0.m_Data);
      Kumu::Result_t::operator=((Result_t *)this,local_88);
      Kumu::Result_t::~Result_t(local_88);
    }
  }
  FrameBuffer::~FrameBuffer(&local_b0);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::WriteToFile(Kumu::FileWriter& Writer)
{
  ASDCP::FrameBuffer Buffer;
  Result_t result = Buffer.Capacity(128*1024);

  if ( ASDCP_SUCCESS(result) )
    result = WriteToBuffer(Buffer);

  if ( ASDCP_SUCCESS(result) )
  result = Writer.Write(Buffer.RoData(), Buffer.Size());

  return result;
}